

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_greedy
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ZSTD_compressionParameters *cParams_00;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  U32 *pUVar7;
  seqDef *psVar8;
  bool bVar9;
  uint uVar10;
  BYTE *pStart;
  uint uVar11;
  ulong *puVar12;
  ulong uVar13;
  uint uVar14;
  ulong *ip_00;
  ulong *puVar15;
  BYTE *pBVar16;
  uint uVar17;
  int iVar18;
  ulong *puVar19;
  ulong uVar20;
  ulong uVar21;
  BYTE *pBVar22;
  ulong *puVar23;
  U32 UVar24;
  ulong *puVar25;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  uint uVar31;
  BYTE *ip;
  BYTE *pInLoopLimit;
  ZSTD_compressionParameters *cParams;
  ulong local_b0;
  uint local_94;
  
  puVar12 = (ulong *)((long)src + srcSize);
  puVar25 = (ulong *)((long)src + (srcSize - 8));
  pBVar22 = (ms->window).base + (ms->window).dictLimit;
  uVar4 = rep[1];
  ip_00 = (ulong *)((ulong)((int)src == (int)pBVar22) + (long)src);
  uVar27 = (int)ip_00 - (int)pBVar22;
  uVar20 = (ulong)uVar4;
  if (uVar27 < uVar4) {
    uVar20 = 0;
  }
  uVar31 = (uint)uVar20;
  uVar5 = *rep;
  ms->nextToUpdate3 = ms->nextToUpdate;
  uVar21 = (ulong)uVar5;
  if (uVar27 < uVar5) {
    uVar21 = 0;
  }
  uVar30 = (uint)uVar21;
  if (ip_00 < puVar25) {
    cParams_00 = &ms->cParams;
    puVar1 = (ulong *)((long)puVar12 - 7);
    puVar2 = (ulong *)((long)puVar12 - 3);
    puVar3 = (ulong *)((long)puVar12 - 1);
    do {
      local_94 = (uint)uVar20;
      uVar31 = (uint)uVar21;
      if ((uVar31 == 0) ||
         (*(int *)((long)((long)ip_00 + 1U) - uVar21) != *(int *)((long)ip_00 + 1))) {
        uVar30 = (ms->cParams).minMatch;
        iVar18 = (int)ip_00;
        if (uVar30 - 6 < 2) {
          pUVar7 = ms->chainTable;
          uVar14 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
          pBVar16 = (ms->window).base;
          uVar30 = (ms->window).lowLimit;
          uVar17 = iVar18 - (int)pBVar16;
          uVar11 = uVar17 - uVar14;
          if (uVar17 < uVar14) {
            uVar11 = 0;
          }
          uVar6 = (ms->cParams).searchLog;
          uVar10 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)ip_00,6);
          if (uVar10 <= uVar30) goto LAB_001436b5;
          iVar18 = 1 << ((byte)uVar6 & 0x1f);
          local_b0 = 999999999;
          uVar13 = 3;
          do {
            puVar23 = (ulong *)(pBVar16 + uVar10);
            if (*(char *)(uVar13 + (long)puVar23) == *(char *)((long)ip_00 + uVar13)) {
              puVar15 = ip_00;
              if (ip_00 < puVar1) {
                uVar26 = *ip_00 ^ *puVar23;
                uVar28 = 0;
                if (uVar26 != 0) {
                  for (; (uVar26 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                  }
                }
                uVar28 = uVar28 >> 3 & 0x1fffffff;
                if (*puVar23 == *ip_00) {
                  do {
                    puVar15 = puVar15 + 1;
                    puVar23 = puVar23 + 1;
                    if (puVar1 <= puVar15) goto LAB_00143234;
                    uVar26 = *puVar15 ^ *puVar23;
                    uVar28 = 0;
                    if (uVar26 != 0) {
                      for (; (uVar26 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                      }
                    }
                    uVar28 = (long)puVar15 + ((uVar28 >> 3 & 0x1fffffff) - (long)ip_00);
                  } while (*puVar23 == *puVar15);
                }
              }
              else {
LAB_00143234:
                if ((puVar15 < puVar2) && ((int)*puVar23 == (int)*puVar15)) {
                  puVar15 = (ulong *)((long)puVar15 + 4);
                  puVar23 = (ulong *)((long)puVar23 + 4);
                }
                if ((puVar15 < puVar3) && ((short)*puVar23 == (short)*puVar15)) {
                  puVar15 = (ulong *)((long)puVar15 + 2);
                  puVar23 = (ulong *)((long)puVar23 + 2);
                }
                if (puVar15 < puVar12) {
                  puVar15 = (ulong *)((long)puVar15 + (ulong)((char)*puVar23 == (char)*puVar15));
                }
                uVar28 = (long)puVar15 - (long)ip_00;
              }
            }
            else {
              uVar28 = 0;
            }
            if ((uVar13 < uVar28) &&
               (local_b0 = (ulong)((uVar17 + 2) - uVar10), uVar13 = uVar28,
               (ulong *)((long)ip_00 + uVar28) == puVar12)) {
              bVar9 = false;
            }
            else {
              uVar28 = uVar13;
              if (uVar11 < uVar10) {
                uVar10 = pUVar7[uVar10 & uVar14 - 1];
                bVar9 = true;
              }
              else {
                bVar9 = false;
              }
            }
          } while (((bVar9) && (uVar30 < uVar10)) &&
                  (iVar18 = iVar18 + -1, uVar13 = uVar28, iVar18 != 0));
        }
        else if (uVar30 == 5) {
          pUVar7 = ms->chainTable;
          uVar14 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
          pBVar16 = (ms->window).base;
          uVar30 = (ms->window).lowLimit;
          uVar17 = iVar18 - (int)pBVar16;
          uVar11 = uVar17 - uVar14;
          if (uVar17 < uVar14) {
            uVar11 = 0;
          }
          uVar6 = (ms->cParams).searchLog;
          uVar10 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)ip_00,5);
          if (uVar30 < uVar10) {
            iVar18 = 1 << ((byte)uVar6 & 0x1f);
            local_b0 = 999999999;
            uVar13 = 3;
            do {
              puVar23 = (ulong *)(pBVar16 + uVar10);
              if (*(char *)(uVar13 + (long)puVar23) == *(char *)((long)ip_00 + uVar13)) {
                puVar15 = ip_00;
                if (ip_00 < puVar1) {
                  uVar26 = *ip_00 ^ *puVar23;
                  uVar28 = 0;
                  if (uVar26 != 0) {
                    for (; (uVar26 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                    }
                  }
                  uVar28 = uVar28 >> 3 & 0x1fffffff;
                  if (*puVar23 == *ip_00) {
                    do {
                      puVar15 = puVar15 + 1;
                      puVar23 = puVar23 + 1;
                      if (puVar1 <= puVar15) goto LAB_001433f8;
                      uVar26 = *puVar15 ^ *puVar23;
                      uVar28 = 0;
                      if (uVar26 != 0) {
                        for (; (uVar26 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                        }
                      }
                      uVar28 = (long)puVar15 + ((uVar28 >> 3 & 0x1fffffff) - (long)ip_00);
                    } while (*puVar23 == *puVar15);
                  }
                }
                else {
LAB_001433f8:
                  if ((puVar15 < puVar2) && ((int)*puVar23 == (int)*puVar15)) {
                    puVar15 = (ulong *)((long)puVar15 + 4);
                    puVar23 = (ulong *)((long)puVar23 + 4);
                  }
                  if ((puVar15 < puVar3) && ((short)*puVar23 == (short)*puVar15)) {
                    puVar15 = (ulong *)((long)puVar15 + 2);
                    puVar23 = (ulong *)((long)puVar23 + 2);
                  }
                  if (puVar15 < puVar12) {
                    puVar15 = (ulong *)((long)puVar15 + (ulong)((char)*puVar23 == (char)*puVar15));
                  }
                  uVar28 = (long)puVar15 - (long)ip_00;
                }
              }
              else {
                uVar28 = 0;
              }
              if ((uVar13 < uVar28) &&
                 (local_b0 = (ulong)((uVar17 + 2) - uVar10), uVar13 = uVar28,
                 (ulong *)((long)ip_00 + uVar28) == puVar12)) {
                bVar9 = false;
              }
              else {
                uVar28 = uVar13;
                if (uVar11 < uVar10) {
                  uVar10 = pUVar7[uVar10 & uVar14 - 1];
                  bVar9 = true;
                }
                else {
                  bVar9 = false;
                }
              }
            } while (((bVar9) && (uVar30 < uVar10)) &&
                    (iVar18 = iVar18 + -1, uVar13 = uVar28, iVar18 != 0));
          }
          else {
LAB_001436b5:
            uVar28 = 3;
            local_b0 = 999999999;
          }
        }
        else {
          pUVar7 = ms->chainTable;
          uVar14 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
          pBVar16 = (ms->window).base;
          uVar30 = (ms->window).lowLimit;
          uVar17 = iVar18 - (int)pBVar16;
          uVar11 = uVar17 - uVar14;
          if (uVar17 < uVar14) {
            uVar11 = 0;
          }
          uVar6 = (ms->cParams).searchLog;
          uVar10 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)ip_00,4);
          if (uVar10 <= uVar30) goto LAB_001436b5;
          iVar18 = 1 << ((byte)uVar6 & 0x1f);
          local_b0 = 999999999;
          uVar13 = 3;
          do {
            puVar23 = (ulong *)(pBVar16 + uVar10);
            if (*(char *)(uVar13 + (long)puVar23) == *(char *)((long)ip_00 + uVar13)) {
              puVar15 = ip_00;
              if (ip_00 < puVar1) {
                uVar26 = *ip_00 ^ *puVar23;
                uVar28 = 0;
                if (uVar26 != 0) {
                  for (; (uVar26 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                  }
                }
                uVar28 = uVar28 >> 3 & 0x1fffffff;
                if (*puVar23 == *ip_00) {
                  do {
                    puVar15 = puVar15 + 1;
                    puVar23 = puVar23 + 1;
                    if (puVar1 <= puVar15) goto LAB_00143611;
                    uVar26 = *puVar15 ^ *puVar23;
                    uVar28 = 0;
                    if (uVar26 != 0) {
                      for (; (uVar26 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                      }
                    }
                    uVar28 = (long)puVar15 + ((uVar28 >> 3 & 0x1fffffff) - (long)ip_00);
                  } while (*puVar23 == *puVar15);
                }
              }
              else {
LAB_00143611:
                if ((puVar15 < puVar2) && ((int)*puVar23 == (int)*puVar15)) {
                  puVar15 = (ulong *)((long)puVar15 + 4);
                  puVar23 = (ulong *)((long)puVar23 + 4);
                }
                if ((puVar15 < puVar3) && ((short)*puVar23 == (short)*puVar15)) {
                  puVar15 = (ulong *)((long)puVar15 + 2);
                  puVar23 = (ulong *)((long)puVar23 + 2);
                }
                if (puVar15 < puVar12) {
                  puVar15 = (ulong *)((long)puVar15 + (ulong)((char)*puVar23 == (char)*puVar15));
                }
                uVar28 = (long)puVar15 - (long)ip_00;
              }
            }
            else {
              uVar28 = 0;
            }
            if ((uVar13 < uVar28) &&
               (local_b0 = (ulong)((uVar17 + 2) - uVar10), uVar13 = uVar28,
               (ulong *)((long)ip_00 + uVar28) == puVar12)) {
              bVar9 = false;
            }
            else {
              uVar28 = uVar13;
              if (uVar11 < uVar10) {
                uVar10 = pUVar7[uVar10 & uVar14 - 1];
                bVar9 = true;
              }
              else {
                bVar9 = false;
              }
            }
          } while (((bVar9) && (uVar30 < uVar10)) &&
                  (iVar18 = iVar18 + -1, uVar13 = uVar28, iVar18 != 0));
        }
        if (3 < uVar28) {
          if (local_b0 == 0) {
            UVar24 = 1;
          }
          else {
            if ((src < ip_00) && (pBVar22 < (BYTE *)((long)ip_00 + (2 - local_b0)))) {
              puVar23 = ip_00;
              while (ip_00 = puVar23,
                    *(char *)((long)puVar23 - 1) == *(char *)((long)puVar23 + (1 - local_b0))) {
                ip_00 = (ulong *)((long)puVar23 - 1);
                uVar28 = uVar28 + 1;
                if ((ip_00 <= src) ||
                   (pBVar16 = (BYTE *)((long)puVar23 + (1 - local_b0)), puVar23 = ip_00,
                   pBVar16 <= pBVar22)) break;
              }
            }
            uVar21 = (ulong)((int)local_b0 - 2);
            UVar24 = (int)local_b0 + 1;
            local_94 = uVar31;
          }
          goto LAB_0014374d;
        }
        ip_00 = (ulong *)((long)ip_00 + ((long)ip_00 - (long)src >> 8) + 1);
      }
      else {
        puVar23 = (ulong *)((long)ip_00 + 5);
        puVar19 = (ulong *)((long)ip_00 + (5 - uVar21));
        puVar15 = puVar23;
        if (puVar23 < puVar1) {
          uVar13 = *puVar23 ^ *puVar19;
          uVar20 = 0;
          if (uVar13 != 0) {
            for (; (uVar13 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
            }
          }
          uVar28 = uVar20 >> 3 & 0x1fffffff;
          if (*puVar19 == *puVar23) {
            puVar15 = (ulong *)((long)ip_00 + 0xd);
            puVar19 = (ulong *)((long)ip_00 + (0xd - uVar21));
            do {
              if (puVar1 <= puVar15) goto LAB_001434aa;
              uVar20 = *puVar19;
              uVar13 = *puVar15;
              uVar26 = uVar13 ^ uVar20;
              uVar28 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                }
              }
              uVar28 = (long)puVar15 + ((uVar28 >> 3 & 0x1fffffff) - (long)puVar23);
              puVar15 = puVar15 + 1;
              puVar19 = puVar19 + 1;
            } while (uVar20 == uVar13);
          }
        }
        else {
LAB_001434aa:
          if ((puVar15 < puVar2) && ((int)*puVar19 == (int)*puVar15)) {
            puVar15 = (ulong *)((long)puVar15 + 4);
            puVar19 = (ulong *)((long)puVar19 + 4);
          }
          if ((puVar15 < puVar3) && ((short)*puVar19 == (short)*puVar15)) {
            puVar15 = (ulong *)((long)puVar15 + 2);
            puVar19 = (ulong *)((long)puVar19 + 2);
          }
          if (puVar15 < puVar12) {
            puVar15 = (ulong *)((long)puVar15 + (ulong)((char)*puVar19 == (char)*puVar15));
          }
          uVar28 = (long)puVar15 - (long)puVar23;
        }
        uVar28 = uVar28 + 4;
        UVar24 = 1;
        ip_00 = (ulong *)((long)ip_00 + 1U);
LAB_0014374d:
        uVar20 = (long)ip_00 - (long)src;
        puVar15 = (ulong *)seqStore->lit;
        puVar23 = (ulong *)((long)puVar15 + uVar20);
        do {
          *puVar15 = *src;
          puVar15 = puVar15 + 1;
          src = (void *)((long)src + 8);
        } while (puVar15 < puVar23);
        seqStore->lit = seqStore->lit + uVar20;
        if (0xffff < uVar20) {
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar8 = seqStore->sequences;
        psVar8->litLength = (U16)uVar20;
        psVar8->offset = UVar24;
        if (0xffff < uVar28 - 3) {
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar8 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar8->matchLength = (U16)(uVar28 - 3);
        seqStore->sequences = psVar8 + 1;
        ip_00 = (ulong *)((long)ip_00 + uVar28);
        uVar20 = (ulong)local_94;
        src = ip_00;
        if ((local_94 != 0) && (ip_00 <= puVar25)) {
          while (uVar28 = uVar21, uVar13 = uVar20, uVar20 = uVar13, uVar21 = uVar28, src = ip_00,
                (int)*ip_00 == *(int *)((long)ip_00 - uVar13)) {
            puVar23 = (ulong *)((long)ip_00 + 4);
            puVar19 = (ulong *)((long)ip_00 + (4 - uVar13));
            puVar15 = puVar23;
            if (puVar23 < puVar1) {
              uVar21 = *puVar23 ^ *puVar19;
              uVar20 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                }
              }
              uVar20 = uVar20 >> 3 & 0x1fffffff;
              if (*puVar19 == *puVar23) {
                puVar15 = (ulong *)((long)ip_00 + 0xc);
                puVar19 = (ulong *)((long)ip_00 + (0xc - uVar13));
                do {
                  if (puVar1 <= puVar15) goto LAB_00143882;
                  uVar21 = *puVar19;
                  uVar26 = *puVar15;
                  uVar29 = uVar26 ^ uVar21;
                  uVar20 = 0;
                  if (uVar29 != 0) {
                    for (; (uVar29 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                    }
                  }
                  uVar20 = (long)puVar15 + ((uVar20 >> 3 & 0x1fffffff) - (long)puVar23);
                  puVar15 = puVar15 + 1;
                  puVar19 = puVar19 + 1;
                } while (uVar21 == uVar26);
              }
            }
            else {
LAB_00143882:
              if ((puVar15 < puVar2) && ((int)*puVar19 == (int)*puVar15)) {
                puVar15 = (ulong *)((long)puVar15 + 4);
                puVar19 = (ulong *)((long)puVar19 + 4);
              }
              if ((puVar15 < puVar3) && ((short)*puVar19 == (short)*puVar15)) {
                puVar15 = (ulong *)((long)puVar15 + 2);
                puVar19 = (ulong *)((long)puVar19 + 2);
              }
              if (puVar15 < puVar12) {
                puVar15 = (ulong *)((long)puVar15 + (ulong)((char)*puVar19 == (char)*puVar15));
              }
              uVar20 = (long)puVar15 - (long)puVar23;
            }
            *(ulong *)seqStore->lit = *ip_00;
            psVar8 = seqStore->sequences;
            psVar8->litLength = 0;
            psVar8->offset = 1;
            if (0xffff < uVar20 + 1) {
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar8 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar8->matchLength = (U16)(uVar20 + 1);
            seqStore->sequences = psVar8 + 1;
            ip_00 = (ulong *)((long)ip_00 + uVar20 + 4);
            uVar20 = uVar28;
            uVar21 = uVar13;
            src = ip_00;
            if (((int)uVar28 == 0) || (puVar25 < ip_00)) break;
          }
        }
      }
      uVar31 = (uint)uVar20;
      uVar30 = (uint)uVar21;
    } while (ip_00 < puVar25);
  }
  uVar11 = 0;
  if (uVar27 < uVar4) {
    uVar11 = uVar4;
  }
  if (uVar27 < uVar5) {
    uVar11 = uVar5;
  }
  if (uVar30 == 0) {
    uVar30 = uVar11;
  }
  if (uVar31 != 0) {
    uVar11 = uVar31;
  }
  *rep = uVar30;
  rep[1] = uVar11;
  return (long)puVar12 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_greedy(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, 0, 0, ZSTD_noDict);
}